

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O0

void Bmc_PerformFindFlopOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRegs)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vRegs_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                      ,0x13e,
                      "void Bmc_PerformFindFlopOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      Bmc_PerformFindFlopOrder_rec(p,pGVar2,vRegs);
      pGVar2 = Gia_ObjFanin1(pObj);
      Bmc_PerformFindFlopOrder_rec(p,pGVar2,vRegs);
    }
    else {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjId(p,pObj);
        Vec_IntPush(vRegs,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Bmc_PerformFindFlopOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRegs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRegs, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Bmc_PerformFindFlopOrder_rec( p, Gia_ObjFanin0(pObj), vRegs );
    Bmc_PerformFindFlopOrder_rec( p, Gia_ObjFanin1(pObj), vRegs );
}